

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_subx_16_mm(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint addr_in;
  
  uVar5 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = uVar5;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar1 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  addr_in = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20) - 2;
  *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar5 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar4 = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) + (uVar2 - uVar1);
  m68ki_cpu.x_flag = uVar4 >> 8;
  m68ki_cpu.v_flag = ((uVar2 ^ uVar4) & (uVar1 ^ uVar2)) >> 8;
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar4 & 0xffff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_16(addr_in & m68ki_cpu.address_mask,uVar4 & 0xffff);
  return;
}

Assistant:

static void m68k_op_subx_16_mm(void)
{
	uint src = OPER_AY_PD_16();
	uint ea  = EA_AX_PD_16();
	uint dst = m68ki_read_16(ea);
	uint res = dst - src - XFLAG_AS_1();

	FLAG_N = NFLAG_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);

	res = MASK_OUT_ABOVE_16(res);
	FLAG_Z |= res;

	m68ki_write_16(ea, res);
}